

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall Omega_h::element_implied_length_metrics_dim<3>(Omega_h *this,Mesh *mesh)

{
  LO LVar1;
  void *extraout_RDX;
  Reals RVar2;
  Write<double> out;
  Reals coords;
  LOs ev2v;
  type f;
  Reals sizes;
  allocator local_a1;
  Write<double> local_a0;
  Write<signed_char> local_90;
  undefined1 local_80 [32];
  type local_60;
  
  Mesh::ask_elem_verts((Mesh *)(local_80 + 0x10));
  Mesh::coords((Mesh *)local_80);
  Mesh::ask_sizes((Mesh *)&stack0xffffffffffffffd0);
  LVar1 = Mesh::nelems(mesh);
  std::__cxx11::string::string((string *)&local_60,"",&local_a1);
  Write<double>::Write(&local_a0,LVar1 * 6,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  Write<int>::Write((Write<int> *)&local_60,(Write<int> *)(local_80 + 0x10));
  Write<double>::Write(&local_60.coords.write_,(Write<double> *)local_80);
  Write<double>::Write(&local_60.out,&local_a0);
  LVar1 = Mesh::nelems(mesh);
  parallel_for<Omega_h::element_implied_length_metrics_dim<3>(Omega_h::Mesh*)::_lambda(int)_1_>
            (LVar1,&local_60,"element_implied_length_metrics");
  Write<double>::Write(&local_90,(Write<signed_char> *)&local_a0);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_90);
  Write<double>::~Write((Write<double> *)&local_90);
  element_implied_length_metrics_dim<3>(Omega_h::Mesh*)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)&local_60);
  Write<double>::~Write(&local_a0);
  Write<double>::~Write((Write<double> *)&stack0xffffffffffffffd0);
  Write<double>::~Write((Write<double> *)local_80);
  Write<int>::~Write((Write<int> *)(local_80 + 0x10));
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals element_implied_length_metrics_dim(Mesh* mesh) {
  auto ev2v = mesh->ask_elem_verts();
  auto coords = mesh->coords();
  auto sizes = mesh->ask_sizes();
  auto out = Write<Real>(mesh->nelems() * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto v = gather_verts<dim + 1>(ev2v, e);
    auto p = gather_vectors<dim + 1, dim>(coords, v);
    auto m = element_implied_metric(p);
    set_symm(out, e, m);
  };
  parallel_for(mesh->nelems(), f, "element_implied_length_metrics");
  return out;
}